

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerApp::OnDatasetChanged(CommissionerApp *this)

{
  element_type *peVar1;
  anon_class_8_1_8991fb9c local_70;
  function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  local_68;
  anon_class_8_1_8991fb9c local_38;
  function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  local_30;
  CommissionerApp *local_10;
  CommissionerApp *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  local_38.this = this;
  std::function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerApp::OnDatasetChanged()::__0,void>
            ((function<void(ot::commissioner::ActiveOperationalDataset_const*,ot::commissioner::Error)>
              *)&local_30,&local_38);
  (*peVar1->_vptr_Commissioner[0x19])(peVar1,&local_30,0xffff);
  std::function<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error)>
  ::~function(&local_30);
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  local_70.this = this;
  std::function<void(ot::commissioner::PendingOperationalDataset_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerApp::OnDatasetChanged()::__1,void>
            ((function<void(ot::commissioner::PendingOperationalDataset_const*,ot::commissioner::Error)>
              *)&local_68,&local_70);
  (*peVar1->_vptr_Commissioner[0x1f])(peVar1,&local_68,0xffff);
  std::function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  ::~function(&local_68);
  return;
}

Assistant:

void CommissionerApp::OnDatasetChanged()
{
    mCommissioner->GetActiveDataset(
        [this](const ActiveOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mActiveDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);

    mCommissioner->GetPendingDataset(
        [this](const PendingOperationalDataset *aDataset, Error aError) {
            if (aError == ErrorCode::kNone)
            {
                // FIXME(wgtdkp): synchronization
                mPendingDataset = *aDataset;
            }
            else
            {
                // TODO(wgtdkp): logging
            }
        },
        0xFFFF);
}